

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[33],char_const*,char[27],float,char[3],float,char[3],float,char[3],float,char[131]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char **Args_1,
          char (*Args_2) [27],float *Args_3,char (*Args_4) [3],float *Args_5,char (*Args_6) [3],
          float *Args_7,char (*Args_8) [3],float *Args_9,char (*Args_10) [131])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char_const*,char[27],float,char[3],float,char[3],float,char[3],float,char[131]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [33])this,(char **)Args,(char (*) [27])Args_1,(float *)Args_2,
             (char (*) [3])Args_3,(float *)Args_4,(char (*) [3])Args_5,(float *)Args_6,
             (char (*) [3])Args_7,(float *)Args_8,(char (*) [131])Args_9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}